

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O3

BaseResultRenderer * __thiscall
duckdb::BaseResultRenderer::operator<<(BaseResultRenderer *this,char c)

{
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  ::std::__cxx11::string::_M_construct((ulong)local_38,'\x01');
  (*this->_vptr_BaseResultRenderer[2])(this,local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return this;
}

Assistant:

BaseResultRenderer &BaseResultRenderer::operator<<(char c) {
	RenderLayout(string(1, c));
	return *this;
}